

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::BuildXformNodeFromStage
               (Stage *stage,XformNode *rootNode,double t,TimeSampleInterpolationType tinterp)

{
  matrix4d rootMat_00;
  bool bVar1;
  bool *pbVar2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this;
  reference prim;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  double dStack_8c8;
  undefined1 local_8c0 [8];
  matrix4d rootMat;
  XformNode node;
  Prim *root;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  matrix4d local_4f8;
  matrix4d local_478;
  allocator local_3f1;
  string local_3f0;
  allocator local_3c9;
  string local_3c8;
  Path local_3a8;
  undefined1 local_2d8 [8];
  XformNode stage_root;
  TimeSampleInterpolationType tinterp_local;
  double t_local;
  XformNode *rootNode_local;
  Stage *stage_local;
  
  if (rootNode == (XformNode *)0x0) {
    stage_local._7_1_ = 0;
  }
  else {
    stage_root._parent_world_matrix.m[3][3]._4_4_ = tinterp;
    XformNode::XformNode((XformNode *)local_2d8);
    ::std::__cxx11::string::operator=((string *)local_2d8,"");
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3c8,"/",&local_3c9);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_3f0,"",&local_3f1);
    Path::Path(&local_3a8,&local_3c8,&local_3f0);
    Path::operator=((Path *)((long)&stage_root.element_name.field_2 + 8),&local_3a8);
    Path::~Path(&local_3a8);
    ::std::__cxx11::string::~string((string *)&local_3f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
    ::std::__cxx11::string::~string((string *)&local_3c8);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
    pbVar2 = XformNode::has_xform((XformNode *)local_2d8);
    *pbVar2 = false;
    stage_root.prim_id = 0;
    stage_root.absolute_path._valid = false;
    stage_root.absolute_path._201_7_ = 0;
    stage_root.prim = (Prim *)0xffffffffffffffff;
    pbVar2 = XformNode::has_resetXformStack((XformNode *)local_2d8);
    *pbVar2 = false;
    tinyusdz::value::matrix4d::identity();
    XformNode::set_parent_world_matrix((XformNode *)local_2d8,&local_478);
    tinyusdz::value::matrix4d::identity();
    XformNode::set_world_matrix((XformNode *)local_2d8,&local_4f8);
    tinyusdz::value::matrix4d::identity();
    XformNode::set_local_matrix((XformNode *)local_2d8,(matrix4d *)&__range2);
    this = Stage::root_prims(stage);
    __end2._M_current =
         (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin
                           ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    root = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end
                             ((vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *)this);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                  *)&root);
      if (!bVar1) break;
      prim = __gnu_cxx::
             __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
             ::operator*(&__end2);
      XformNode::XformNode((XformNode *)(rootMat.m[3] + 3));
      tinyusdz::value::matrix4d::identity();
      memcpy(&local_940,local_8c0,0x80);
      rootMat_00.m[0][1] = (double)uStack_938;
      rootMat_00.m[0][0] = (double)local_940;
      rootMat_00.m[0][2] = (double)local_930;
      rootMat_00.m[0][3] = (double)uStack_928;
      rootMat_00.m[1][0] = (double)local_920;
      rootMat_00.m[1][1] = (double)uStack_918;
      rootMat_00.m[1][2] = (double)local_910;
      rootMat_00.m[1][3] = (double)uStack_908;
      rootMat_00.m[2][0] = (double)local_900;
      rootMat_00.m[2][1] = (double)uStack_8f8;
      rootMat_00.m[2][2] = (double)local_8f0;
      rootMat_00.m[2][3] = (double)uStack_8e8;
      rootMat_00.m[3][0] = (double)local_8e0;
      rootMat_00.m[3][1] = (double)uStack_8d8;
      rootMat_00.m[3][2] = (double)local_8d0;
      rootMat_00.m[3][3] = dStack_8c8;
      bVar1 = anon_unknown_6::BuildXformNodeFromStageRec
                        (stage,(Path *)((long)&stage_root.element_name.field_2 + 8),prim,
                         (XformNode *)(rootMat.m[3] + 3),rootMat_00,t,
                         stage_root._parent_world_matrix.m[3][3]._4_4_);
      if (bVar1) {
        ::std::vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>::
        emplace_back<tinyusdz::tydra::XformNode>
                  ((vector<tinyusdz::tydra::XformNode,_std::allocator<tinyusdz::tydra::XformNode>_>
                    *)&stage_root.parent,(XformNode *)(rootMat.m[3] + 3));
      }
      else {
        stage_local._7_1_ = 0;
      }
      XformNode::~XformNode((XformNode *)(rootMat.m[3] + 3));
      if (!bVar1) goto LAB_007dcccb;
      __gnu_cxx::
      __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
      ::operator++(&__end2);
    }
    XformNode::operator=(rootNode,(XformNode *)local_2d8);
    stage_local._7_1_ = 1;
LAB_007dcccb:
    XformNode::~XformNode((XformNode *)local_2d8);
  }
  return (bool)(stage_local._7_1_ & 1);
}

Assistant:

bool BuildXformNodeFromStage(
    const tinyusdz::Stage &stage, XformNode *rootNode, /* out */
    const double t,
    const tinyusdz::value::TimeSampleInterpolationType tinterp) {
  if (!rootNode) {
    return false;
  }

  XformNode stage_root;
  stage_root.element_name = "";  // Stage root element name is empty.
  stage_root.absolute_path = Path("/", "");
  stage_root.has_xform() = false;
  stage_root.parent = nullptr;
  stage_root.prim = nullptr;  // No prim for stage root.
  stage_root.prim_id = -1;
  stage_root.has_resetXformStack() = false;
  stage_root.set_parent_world_matrix(value::matrix4d::identity());
  stage_root.set_world_matrix(value::matrix4d::identity());
  stage_root.set_local_matrix(value::matrix4d::identity());

  for (const auto &root : stage.root_prims()) {
    XformNode node;

    value::matrix4d rootMat{value::matrix4d::identity()};

    if (!BuildXformNodeFromStageRec(stage, stage_root.absolute_path, &root,
                                    &node, rootMat, t, tinterp)) {
      return false;
    }

    stage_root.children.emplace_back(std::move(node));
  }

  (*rootNode) = stage_root;

  return true;
}